

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_binder.cpp
# Opt level: O1

optional_idx __thiscall
duckdb::FunctionBinder::MultipleCandidateException<duckdb::AggregateFunction>
          (FunctionBinder *this,string *name,FunctionSet<duckdb::AggregateFunction> *functions,
          vector<unsigned_long,_true> *candidate_functions,
          vector<duckdb::LogicalType,_true> *arguments,ErrorData *error)

{
  ErrorData *pEVar1;
  undefined1 auVar2 [8];
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  idx_t *piVar6;
  string candidate_str;
  string call_str;
  AggregateFunction f;
  string local_278;
  long *local_258;
  long local_250;
  long local_248;
  long lStack_240;
  ErrorData *local_238;
  idx_t *local_230;
  FunctionSet<duckdb::AggregateFunction> *local_228;
  undefined1 *local_220;
  long local_218;
  undefined1 local_210 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  string local_1a0;
  string local_180;
  undefined1 local_160 [8];
  undefined1 local_158 [32];
  _Alloc_hider local_138;
  char local_128 [16];
  vector<duckdb::LogicalType,_true> local_118 [2];
  LogicalType local_e8;
  LogicalType local_d0 [6];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)arguments;
  local_238 = error;
  local_228 = functions;
  LogicalType::LogicalType((LogicalType *)local_160,INVALID);
  Function::CallToString(&local_180,name,arguments,(LogicalType *)local_160);
  LogicalType::~LogicalType((LogicalType *)local_160);
  local_220 = local_210;
  local_218 = 0;
  local_210[0] = 0;
  piVar6 = (candidate_functions->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_230 = (candidate_functions->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (piVar6 != local_230) {
    do {
      FunctionSet<duckdb::AggregateFunction>::GetFunctionByOffset
                ((AggregateFunction *)local_160,local_228,*piVar6);
      Function::CallToString(&local_1a0,(string *)local_158,local_118,&local_e8,local_d0);
      params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001;
      plVar3 = (long *)::std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,0x1f90f77);
      local_258 = &local_248;
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_248 = *plVar4;
        lStack_240 = plVar3[3];
      }
      else {
        local_248 = *plVar4;
        local_258 = (long *)*plVar3;
      }
      local_250 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)::std::__cxx11::string::append((char *)&local_258);
      psVar5 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_278.field_2._M_allocated_capacity = *psVar5;
        local_278.field_2._8_8_ = plVar3[3];
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      }
      else {
        local_278.field_2._M_allocated_capacity = *psVar5;
        local_278._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_278._M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_278._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p);
      }
      if (local_258 != &local_248) {
        operator_delete(local_258);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p);
      }
      local_160 = (undefined1  [8])&PTR__AggregateFunction_02477a08;
      if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
      }
      local_160 = (undefined1  [8])&PTR__BaseScalarFunction_02474b40;
      LogicalType::~LogicalType(local_d0);
      SimpleFunction::~SimpleFunction((SimpleFunction *)local_160);
      piVar6 = piVar6 + 1;
    } while (piVar6 != local_230);
  }
  local_1c0[0] = local_1b0;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c0,
             "Could not choose a best candidate function for the function call \"%s\". In order to select one, please add explicit type casts.\n\tCandidate functions:\n%s"
             ,"");
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,local_180._M_dataplus._M_p,
             local_180._M_dataplus._M_p + local_180._M_string_length);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_200,local_220,local_220 + local_218);
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
            (&local_278,(StringUtil *)local_1c0,&local_1e0,&local_200,params_1);
  ErrorData::ErrorData((ErrorData *)local_160,BINDER,&local_278);
  auVar2 = local_160;
  pEVar1 = local_238;
  local_238->initialized = (bool)local_160[0];
  local_238->type = local_160[1];
  local_160 = auVar2;
  ::std::__cxx11::string::operator=((string *)&local_238->raw_message,(string *)local_158);
  ::std::__cxx11::string::operator=((string *)&pEVar1->final_message,(string *)&local_138);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&pEVar1->extra_info,
                   (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)local_118);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_118);
  if (local_138._M_p != local_128) {
    operator_delete(local_138._M_p);
  }
  if ((element_type *)local_158._0_8_ != (element_type *)(local_158 + 0x10)) {
    operator_delete((void *)local_158._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0]);
  }
  if (local_220 != local_210) {
    operator_delete(local_220);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  return (optional_idx)0xffffffffffffffff;
}

Assistant:

optional_idx FunctionBinder::MultipleCandidateException(const string &name, FunctionSet<T> &functions,
                                                        vector<idx_t> &candidate_functions,
                                                        const vector<LogicalType> &arguments, ErrorData &error) {
	D_ASSERT(functions.functions.size() > 1);
	// there are multiple possible function definitions
	// throw an exception explaining which overloads are there
	string call_str = Function::CallToString(name, arguments);
	string candidate_str;
	for (auto &conf : candidate_functions) {
		T f = functions.GetFunctionByOffset(conf);
		candidate_str += "\t" + f.ToString() + "\n";
	}
	error = ErrorData(
	    ExceptionType::BINDER,
	    StringUtil::Format("Could not choose a best candidate function for the function call \"%s\". In order to "
	                       "select one, please add explicit type casts.\n\tCandidate functions:\n%s",
	                       call_str, candidate_str));
	return optional_idx();
}